

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_normalize_space
              (lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  undefined1 uVar1;
  ly_ctx *ctx;
  bool bVar2;
  bool bVar3;
  int iVar4;
  lys_node *plVar5;
  char *pcVar6;
  size_t __size;
  void *ptr;
  lyxp_set_node *plVar7;
  lys_node_leaf *sleaf;
  int ret;
  int space_before;
  int have_spaces;
  char *new;
  uint16_t new_used;
  uint16_t i;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t arg_count_local;
  lyxp_set **args_local;
  
  bVar3 = false;
  bVar2 = false;
  sleaf._4_4_ = 0;
  if ((options & 0x1cU) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    iVar4 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar4 == 0) {
      for (new._2_2_ = 0; *(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) != '\0';
          new._2_2_ = new._2_2_ + 1) {
        if ((((*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == ' ') ||
             (*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\t')) ||
            (*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\n')) ||
           (*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\r')) {
          if (((new._2_2_ == 0) || (bVar2)) ||
             (*(char *)((long)&((set->val).nodes)->node + (long)(int)(new._2_2_ + 1)) == '\0')) {
            bVar3 = true;
            break;
          }
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      if (bVar3) {
        __size = strlen((set->val).str);
        ptr = malloc(__size);
        if (ptr == (void *)0x0) {
          ly_log(param_4->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_normalize_space");
          return -1;
        }
        new._0_2_ = 0;
        bVar2 = false;
        for (new._2_2_ = 0; *(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) != '\0';
            new._2_2_ = new._2_2_ + 1) {
          if (((*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == ' ') ||
              (*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\t')) ||
             ((*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\n' ||
              (*(char *)((long)&((set->val).nodes)->node + (ulong)new._2_2_) == '\r')))) {
            if ((new._2_2_ != 0) && (!bVar2)) {
              bVar2 = true;
              goto LAB_001c3dd0;
            }
            bVar2 = true;
          }
          else {
            bVar2 = false;
LAB_001c3dd0:
            if (bVar2) {
              uVar1 = 0x20;
            }
            else {
              uVar1 = *(undefined1 *)((long)&((set->val).nodes)->node + (ulong)new._2_2_);
            }
            *(undefined1 *)((long)ptr + (ulong)(ushort)new) = uVar1;
            new._0_2_ = (ushort)new + 1;
          }
        }
        if (((ushort)new != 0) &&
           ((((*(char *)((long)ptr + (long)(int)((ushort)new - 1)) == ' ' ||
              (*(char *)((long)ptr + (long)(int)((ushort)new - 1)) == '\t')) ||
             (*(char *)((long)ptr + (long)(int)((ushort)new - 1)) == '\n')) ||
            (*(char *)((long)ptr + (long)(int)((ushort)new - 1)) == '\r')))) {
          new._0_2_ = (ushort)new - 1;
        }
        plVar7 = (lyxp_set_node *)ly_realloc(ptr,(long)(int)((ushort)new + 1));
        if (plVar7 == (lyxp_set_node *)0x0) {
          ly_log(param_4->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_normalize_space");
          return -1;
        }
        *(undefined1 *)((long)&plVar7->node + (ulong)(ushort)new) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar7;
      }
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = 0xffffffff;
    }
  }
  else {
    if (((arg_count != 0) && ((*args)->type == LYXP_SET_SNODE_SET)) &&
       (plVar5 = warn_get_snode_in_ctx(*args), plVar5 != (lys_node *)0x0)) {
      if ((plVar5->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        ctx = param_4->ctx;
        pcVar6 = strnodetype(plVar5->nodetype);
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_normalize_space",pcVar6,plVar5->name);
        sleaf._4_4_ = 1;
      }
      else {
        iVar4 = warn_is_string_type((lys_type *)&plVar5[1].ref);
        if (iVar4 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_normalize_space",
                 plVar5->name);
        }
        sleaf._4_4_ = (uint)(iVar4 == 0);
      }
    }
    set_snode_clear_ctx(set);
    args_local._4_4_ = sleaf._4_4_;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_normalize_space(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                      struct lyxp_set *set, int options)
{
    uint16_t i, new_used;
    char *new;
    int have_spaces = 0, space_before = 0, ret = EXIT_SUCCESS;
    struct lys_node_leaf *sleaf;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return EXIT_SUCCESS;
}